

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fio.c
# Opt level: O1

intptr_t fio_fd2uuid(int fd)

{
  char *pcVar1;
  char cVar2;
  fio_data_s *pfVar3;
  ulong uVar4;
  long lVar5;
  fio_lock_i ret;
  timespec local_38;
  
  pfVar3 = fio_data;
  uVar4 = 0xffffffffffffffff;
  if ((-1 < fd) && ((uint)fd < fio_data->capa)) {
    lVar5 = (ulong)(uint)fd * 0xa8;
    if (*(char *)((long)fio_data + lVar5 + 0x6f) == '\0') {
      LOCK();
      pcVar1 = (char *)((long)fio_data + lVar5 + 0x6c);
      cVar2 = *pcVar1;
      *pcVar1 = '\x01';
      UNLOCK();
      local_38.tv_sec = CONCAT71(local_38.tv_sec._1_7_,cVar2);
      while (cVar2 != '\0') {
        local_38.tv_sec = 0;
        local_38.tv_nsec = 1;
        nanosleep(&local_38,(timespec *)0x0);
        LOCK();
        pcVar1 = (char *)((long)pfVar3 + lVar5 + 0x6c);
        cVar2 = *pcVar1;
        *pcVar1 = '\x01';
        UNLOCK();
        local_38.tv_sec = CONCAT71(local_38.tv_sec._1_7_,cVar2);
      }
      fio_clear_fd((ulong)(uint)fd,'\x01');
      LOCK();
      *(undefined1 *)((long)fio_data + lVar5 + 0x6c) = 0;
      UNLOCK();
    }
    uVar4 = (ulong)CONCAT41(fd,*(undefined1 *)((long)fio_data + lVar5 + 0x6d));
  }
  return uVar4;
}

Assistant:

intptr_t fio_fd2uuid(int fd) {
  if (fd < 0 || (size_t)fd >= fio_data->capa)
    return -1;
  if (!fd_data(fd).open) {
    fio_lock(&fd_data(fd).protocol_lock);
    fio_clear_fd(fd, 1);
    fio_unlock(&fd_data(fd).protocol_lock);
  }
  return fd2uuid(fd);
}